

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_reader.cpp
# Opt level: O1

void __thiscall
duckdb::MultiFileOptions::AutoDetectHiveTypesInternal
          (MultiFileOptions *this,MultiFileList *files,ClientContext *context)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  iterator iVar6;
  _Rb_tree_node_base *p_Var7;
  MultiFileList *pMVar8;
  LogicalType *target_type;
  __node_base _Var9;
  long lVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  LogicalType detected_type;
  MultiFileListIterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  partitions;
  MultiFileListIterator __end1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  detected_types;
  LogicalType candidates [3];
  Value value;
  LogicalType local_228;
  undefined1 local_210 [32];
  LogicalType local_1f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  LogicalType local_1d0;
  LogicalType local_1b0;
  string local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  MultiFileListIterator local_130;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  LogicalType local_b8 [3];
  Value local_70;
  
  LogicalType::LogicalType(local_b8,DATE);
  LogicalType::LogicalType(local_b8 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_b8 + 2,BIGINT);
  local_f0._M_buckets = &local_f0._M_single_bucket;
  local_f0._M_bucket_count = 1;
  local_f0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_f0._M_element_count = 0;
  local_f0._M_rehash_policy._M_max_load_factor = 1.0;
  local_f0._M_rehash_policy._M_next_resize = 0;
  local_f0._M_single_bucket = (__node_base_ptr)0x0;
  MultiFileListIterationHelper::MultiFileListIterationHelper
            ((MultiFileListIterationHelper *)local_210,files);
  pMVar8 = (MultiFileList *)local_210._0_8_;
  iVar4 = (*(*(_func_int ***)local_210._0_8_)[5])(local_210._0_8_);
  if ((char)iVar4 == '\0') {
    pMVar8 = (MultiFileList *)0x0;
  }
  MultiFileListIterationHelper::MultiFileListIterator::MultiFileListIterator
            ((MultiFileListIterator *)local_210,pMVar8);
  MultiFileListIterationHelper::MultiFileListIterator::MultiFileListIterator
            (&local_130,(MultiFileList *)0x0);
  while ((pMVar8 = (MultiFileList *)(local_210 + 0x10),
         (MultiFileList *)local_210._0_8_ != local_130.file_list.ptr ||
         (local_210._8_8_ != local_130.file_scan_data.current_file_idx))) {
    HivePartitioning::Parse
              ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_178,(string *)pMVar8);
    p_Var7 = (_Rb_tree_node_base *)local_178._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_178._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_178);
      if (local_130.current_file.extended_info.internal.
          super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_130.current_file.extended_info.internal.
                   super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.current_file.path._M_dataplus._M_p != &local_130.current_file.path.field_2) {
        operator_delete(local_130.current_file.path._M_dataplus._M_p);
      }
      if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_pi);
      }
      if ((LogicalType *)local_210._16_8_ != &local_1f0) {
        operator_delete((void *)local_210._16_8_);
      }
LAB_015b7f2b:
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_f0);
      lVar10 = 0x30;
      do {
        LogicalType::~LogicalType((LogicalType *)(&local_b8[0].id_ + lVar10));
        lVar10 = lVar10 + -0x18;
      } while (lVar10 != -0x18);
      return;
    }
    while( true ) {
      if ((_Rb_tree_header *)p_Var7 == &local_178._M_impl.super__Rb_tree_header) break;
      iVar5 = ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->hive_types_schema)._M_h,(key_type *)(p_Var7 + 1));
      if (iVar5.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
          ._M_cur == (__node_type *)0x0) {
        LogicalType::LogicalType(&local_228,VARCHAR);
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,*(long *)(p_Var7 + 2),
                   (long)&(p_Var7[2]._M_parent)->_M_color + *(long *)(p_Var7 + 2));
        Value::Value(&local_70,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p);
        }
        lVar10 = 0x48;
        target_type = local_b8;
        do {
          bVar3 = Value::TryCastAs(&local_70,context,target_type,true);
          if (bVar3) {
            if (target_type != &local_228) {
              local_228.id_ = target_type->id_;
              local_228.physical_type_ = target_type->physical_type_;
              shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                        (&local_228.type_info_,&target_type->type_info_);
            }
            break;
          }
          target_type = target_type + 1;
          lVar10 = lVar10 + -0x18;
        } while (lVar10 != 0);
        iVar6 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&local_f0,(key_type *)(p_Var7 + 1));
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            ._M_cur == (__node_type *)0x0) {
          local_1d0._0_8_ =
               &local_1d0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,*(long *)(p_Var7 + 1),
                     (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
          LogicalType::LogicalType(&local_1b0,&local_228);
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&local_f0,(string *)&local_1d0);
          LogicalType::~LogicalType(&local_1b0);
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1d0._0_8_ !=
              &local_1d0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
            operator_delete((void *)local_1d0._0_8_);
          }
        }
        else {
          bVar3 = LogicalType::operator==
                            ((LogicalType *)
                             ((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                    ._M_cur + 0x28),&local_228);
          if (!bVar3) {
            LogicalType::LogicalType(&local_1d0,VARCHAR);
            _Var2._M_pi = local_1d0.type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            peVar1 = local_1d0.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            *(LogicalTypeId *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x28) = local_1d0.id_;
            *(PhysicalType *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x29) = local_1d0.physical_type_;
            uVar11 = *(undefined4 *)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                             ._M_cur + 0x30);
            uVar13 = *(undefined4 *)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                             ._M_cur + 0x38);
            *(undefined8 *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x30) = 0;
            *(undefined8 *)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x38) = 0;
            local_1d0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_1d0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)iVar6.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                              ._M_cur + 0x38);
            *(element_type **)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x30) = peVar1;
            *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
             ((long)iVar6.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                    ._M_cur + 0x38) = _Var2._M_pi;
            uVar12 = *(undefined4 *)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                             ._M_cur + 0x34);
            uVar14 = *(undefined4 *)
                      ((long)iVar6.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                             ._M_cur + 0x3c);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              local_148 = uVar11;
              uStack_144 = *(undefined4 *)
                            ((long)iVar6.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                   ._M_cur + 0x34);
              uStack_140 = uVar13;
              uStack_13c = *(undefined4 *)
                            ((long)iVar6.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                                   ._M_cur + 0x3c);
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              uVar11 = local_148;
              uVar12 = uStack_144;
              uVar13 = uStack_140;
              uVar14 = uStack_13c;
            }
            _Var2._M_pi = local_1d0.type_info_.internal.
                          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_1d0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)CONCAT44(uVar12,uVar11);
            local_1d0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _4_4_ = uVar14;
            local_1d0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
            _0_4_ = uVar13;
            if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
            }
            LogicalType::~LogicalType(&local_1d0);
          }
        }
        Value::~Value(&local_70);
        LogicalType::~LogicalType(&local_228);
      }
      p_Var7 = (_Rb_tree_node_base *)::std::_Rb_tree_increment(p_Var7);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_178);
    MultiFileListIterationHelper::MultiFileListIterator::Next((MultiFileListIterator *)local_210);
  }
  if (local_130.current_file.extended_info.internal.
      super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_130.current_file.extended_info.internal.
               super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130.current_file.path._M_dataplus._M_p != &local_130.current_file.path.field_2) {
    operator_delete(local_130.current_file.path._M_dataplus._M_p);
  }
  if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._M_pi);
  }
  if ((LogicalType *)local_210._16_8_ != &local_1f0) {
    operator_delete((void *)local_210._16_8_);
  }
  if (local_f0._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var9._M_nxt = local_f0._M_before_begin._M_nxt;
    do {
      local_210._0_8_ = pMVar8;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_210,_Var9._M_nxt[1]._M_nxt,
                 (long)&(_Var9._M_nxt[2]._M_nxt)->_M_nxt + (long)_Var9._M_nxt[1]._M_nxt);
      LogicalType::LogicalType(&local_1f0,(LogicalType *)(_Var9._M_nxt + 5));
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&this->hive_types_schema,(string *)local_210);
      LogicalType::~LogicalType(&local_1f0);
      if ((MultiFileList *)local_210._0_8_ != pMVar8) {
        operator_delete((void *)local_210._0_8_);
      }
      _Var9._M_nxt = (_Var9._M_nxt)->_M_nxt;
    } while (_Var9._M_nxt != (_Hash_node_base *)0x0);
  }
  goto LAB_015b7f2b;
}

Assistant:

void MultiFileOptions::AutoDetectHiveTypesInternal(MultiFileList &files, ClientContext &context) {
	const LogicalType candidates[] = {LogicalType::DATE, LogicalType::TIMESTAMP, LogicalType::BIGINT};

	unordered_map<string, LogicalType> detected_types;
	for (const auto &file : files.Files()) {
		auto partitions = HivePartitioning::Parse(file.path);
		if (partitions.empty()) {
			return;
		}

		for (auto &part : partitions) {
			const string &name = part.first;
			if (hive_types_schema.find(name) != hive_types_schema.end()) {
				// type was explicitly provided by the user
				continue;
			}
			LogicalType detected_type = LogicalType::VARCHAR;
			Value value(part.second);
			for (auto &candidate : candidates) {
				const bool success = value.TryCastAs(context, candidate, true);
				if (success) {
					detected_type = candidate;
					break;
				}
			}
			auto entry = detected_types.find(name);
			if (entry == detected_types.end()) {
				// type was not yet detected - insert it
				detected_types.insert(make_pair(name, std::move(detected_type)));
			} else {
				// type was already detected - check if the type matches
				// if not promote to VARCHAR
				if (entry->second != detected_type) {
					entry->second = LogicalType::VARCHAR;
				}
			}
		}
	}
	for (auto &entry : detected_types) {
		hive_types_schema.insert(make_pair(entry.first, std::move(entry.second)));
	}
}